

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cb_explore.cc
# Opt level: O0

base_learner * cb_explore_setup(options_i *options,vw *all)

{
  wclass *pwVar1;
  vw *pvVar2;
  byte bVar3;
  typed_option<unsigned_long> *length;
  pointer pcVar4;
  single_learner *psVar5;
  wclass **ppwVar6;
  ulong uVar7;
  vw *in_RSI;
  learner<char,_example> *in_RDI;
  learner<CB_EXPLORE::cb_explore,_example> *l;
  single_learner *base;
  stringstream ss;
  uint32_t num_actions;
  option_group_definition new_options;
  free_ptr<CB_EXPLORE::cb_explore> data;
  string *in_stack_fffffffffffff498;
  prediction_type_t pred_type;
  vw *in_stack_fffffffffffff4a0;
  string *in_stack_fffffffffffff4a8;
  undefined7 in_stack_fffffffffffff4b0;
  byte in_stack_fffffffffffff4b7;
  learner<char,_example> *in_stack_fffffffffffff4b8;
  allocator *in_stack_fffffffffffff4c0;
  typed_option<float> *in_stack_fffffffffffff4e8;
  learner<char,_example> *plVar8;
  option_group_definition *in_stack_fffffffffffff4f0;
  allocator *paVar9;
  v_array<COST_SENSITIVE::wclass> *this;
  allocator local_921;
  string local_920 [39];
  allocator local_8f9;
  string local_8f8 [32];
  uint *local_8d8;
  uint *puStack_8d0;
  uint *local_8c8;
  size_t sStack_8c0;
  float *local_8b8;
  float *pfStack_8b0;
  float *local_8a8;
  size_t sStack_8a0;
  allocator local_891;
  string local_890 [32];
  vw *local_870;
  single_learner *local_868;
  string local_860 [39];
  allocator local_839;
  string local_838 [32];
  stringstream local_818 [16];
  undefined1 local_808 [383];
  allocator local_689;
  string local_688 [36];
  uint32_t local_664;
  undefined4 local_660;
  allocator local_659;
  string local_658 [39];
  allocator local_631;
  string local_630 [39];
  allocator local_609;
  string local_608 [32];
  typed_option<float> local_5e8;
  allocator local_541;
  string local_540 [39];
  allocator local_519;
  string local_518 [32];
  typed_option<unsigned_long> local_4f8;
  allocator local_451;
  string local_450 [39];
  allocator local_429;
  string local_428 [32];
  typed_option<unsigned_long> local_408;
  allocator local_361;
  string local_360 [39];
  allocator local_339;
  string local_338 [32];
  typed_option<float> local_318;
  undefined1 local_271 [40];
  allocator local_249;
  string local_248 [32];
  typed_option<unsigned_long> local_228;
  allocator local_181;
  string local_180 [39];
  allocator local_159;
  string local_158 [32];
  typed_option<unsigned_int> local_138;
  allocator local_81;
  string local_80 [32];
  undefined1 local_60 [72];
  vw *local_18;
  learner<char,_example> *local_10;
  base_learner *local_8;
  
  local_18 = in_RSI;
  local_10 = in_RDI;
  scoped_calloc_or_throw<CB_EXPLORE::cb_explore>();
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_80,"Contextual Bandit Exploration",&local_81);
  VW::config::option_group_definition::option_group_definition
            ((option_group_definition *)in_stack_fffffffffffff4a0,in_stack_fffffffffffff498);
  std::__cxx11::string::~string(local_80);
  std::allocator<char>::~allocator((allocator<char> *)&local_81);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_158,"cb_explore",&local_159);
  std::unique_ptr<CB_EXPLORE::cb_explore,_void_(*)(void_*)>::operator->
            ((unique_ptr<CB_EXPLORE::cb_explore,_void_(*)(void_*)> *)0x304ad8);
  VW::config::make_option<unsigned_int>(in_stack_fffffffffffff4a8,(uint *)in_stack_fffffffffffff4a0)
  ;
  VW::config::typed_option<unsigned_int>::keep(&local_138,true);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_180,"Online explore-exploit for a <k> action contextual bandit problem",
             &local_181);
  VW::config::typed_option<unsigned_int>::help
            ((typed_option<unsigned_int> *)in_stack_fffffffffffff4a0,in_stack_fffffffffffff498);
  VW::config::option_group_definition::add<VW::config::typed_option<unsigned_int>&>
            (in_stack_fffffffffffff4f0,(typed_option<unsigned_int> *)in_stack_fffffffffffff4e8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_248,"first",&local_249);
  std::unique_ptr<CB_EXPLORE::cb_explore,_void_(*)(void_*)>::operator->
            ((unique_ptr<CB_EXPLORE::cb_explore,_void_(*)(void_*)> *)0x304bc3);
  VW::config::make_option<unsigned_long>
            (in_stack_fffffffffffff4a8,(unsigned_long *)in_stack_fffffffffffff4a0);
  VW::config::typed_option<unsigned_long>::keep(&local_228,true);
  this = (v_array<COST_SENSITIVE::wclass> *)local_271;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)(local_271 + 1),"tau-first exploration",(allocator *)this);
  length = VW::config::typed_option<unsigned_long>::help
                     ((typed_option<unsigned_long> *)in_stack_fffffffffffff4a0,
                      in_stack_fffffffffffff498);
  VW::config::option_group_definition::add<VW::config::typed_option<unsigned_long>&>
            (in_stack_fffffffffffff4f0,(typed_option<unsigned_long> *)in_stack_fffffffffffff4e8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_338,"epsilon",&local_339);
  std::unique_ptr<CB_EXPLORE::cb_explore,_void_(*)(void_*)>::operator->
            ((unique_ptr<CB_EXPLORE::cb_explore,_void_(*)(void_*)> *)0x304cb1);
  VW::config::make_option<float>(in_stack_fffffffffffff4a8,(float *)in_stack_fffffffffffff4a0);
  VW::config::typed_option<float>::keep(&local_318,true);
  VW::config::typed_option<float>::default_value
            ((typed_option<float> *)CONCAT17(in_stack_fffffffffffff4b7,in_stack_fffffffffffff4b0),
             (float)((ulong)in_stack_fffffffffffff4a8 >> 0x20));
  paVar9 = &local_361;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_360,"epsilon-greedy exploration",paVar9);
  VW::config::typed_option<float>::help
            ((typed_option<float> *)in_stack_fffffffffffff4a0,in_stack_fffffffffffff498);
  VW::config::option_group_definition::add<VW::config::typed_option<float>&>
            (in_stack_fffffffffffff4f0,in_stack_fffffffffffff4e8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_428,"bag",&local_429);
  std::unique_ptr<CB_EXPLORE::cb_explore,_void_(*)(void_*)>::operator->
            ((unique_ptr<CB_EXPLORE::cb_explore,_void_(*)(void_*)> *)0x304dbe);
  VW::config::make_option<unsigned_long>
            (in_stack_fffffffffffff4a8,(unsigned_long *)in_stack_fffffffffffff4a0);
  VW::config::typed_option<unsigned_long>::keep(&local_408,true);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_450,"bagging-based exploration",&local_451);
  VW::config::typed_option<unsigned_long>::help
            ((typed_option<unsigned_long> *)in_stack_fffffffffffff4a0,in_stack_fffffffffffff498);
  VW::config::option_group_definition::add<VW::config::typed_option<unsigned_long>&>
            (in_stack_fffffffffffff4f0,(typed_option<unsigned_long> *)in_stack_fffffffffffff4e8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_518,"cover",&local_519);
  std::unique_ptr<CB_EXPLORE::cb_explore,_void_(*)(void_*)>::operator->
            ((unique_ptr<CB_EXPLORE::cb_explore,_void_(*)(void_*)> *)0x304eac);
  VW::config::make_option<unsigned_long>
            (in_stack_fffffffffffff4a8,(unsigned_long *)in_stack_fffffffffffff4a0);
  VW::config::typed_option<unsigned_long>::keep(&local_4f8,true);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_540,"Online cover based exploration",&local_541);
  VW::config::typed_option<unsigned_long>::help
            ((typed_option<unsigned_long> *)in_stack_fffffffffffff4a0,in_stack_fffffffffffff498);
  VW::config::option_group_definition::add<VW::config::typed_option<unsigned_long>&>
            (in_stack_fffffffffffff4f0,(typed_option<unsigned_long> *)in_stack_fffffffffffff4e8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_608,"psi",&local_609);
  std::unique_ptr<CB_EXPLORE::cb_explore,_void_(*)(void_*)>::operator->
            ((unique_ptr<CB_EXPLORE::cb_explore,_void_(*)(void_*)> *)0x304f9a);
  VW::config::make_option<float>(in_stack_fffffffffffff4a8,(float *)in_stack_fffffffffffff4a0);
  VW::config::typed_option<float>::keep(&local_5e8,true);
  VW::config::typed_option<float>::default_value
            ((typed_option<float> *)CONCAT17(in_stack_fffffffffffff4b7,in_stack_fffffffffffff4b0),
             (float)((ulong)in_stack_fffffffffffff4a8 >> 0x20));
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_630,"disagreement parameter for cover",&local_631);
  VW::config::typed_option<float>::help
            ((typed_option<float> *)in_stack_fffffffffffff4a0,in_stack_fffffffffffff498);
  pred_type = (prediction_type_t)((ulong)in_stack_fffffffffffff498 >> 0x20);
  VW::config::option_group_definition::add<VW::config::typed_option<float>&>
            (in_stack_fffffffffffff4f0,in_stack_fffffffffffff4e8);
  std::__cxx11::string::~string(local_630);
  std::allocator<char>::~allocator((allocator<char> *)&local_631);
  VW::config::typed_option<float>::~typed_option((typed_option<float> *)in_stack_fffffffffffff4a0);
  std::__cxx11::string::~string(local_608);
  std::allocator<char>::~allocator((allocator<char> *)&local_609);
  std::__cxx11::string::~string(local_540);
  std::allocator<char>::~allocator((allocator<char> *)&local_541);
  VW::config::typed_option<unsigned_long>::~typed_option
            ((typed_option<unsigned_long> *)in_stack_fffffffffffff4a0);
  std::__cxx11::string::~string(local_518);
  std::allocator<char>::~allocator((allocator<char> *)&local_519);
  std::__cxx11::string::~string(local_450);
  std::allocator<char>::~allocator((allocator<char> *)&local_451);
  VW::config::typed_option<unsigned_long>::~typed_option
            ((typed_option<unsigned_long> *)in_stack_fffffffffffff4a0);
  std::__cxx11::string::~string(local_428);
  std::allocator<char>::~allocator((allocator<char> *)&local_429);
  std::__cxx11::string::~string(local_360);
  std::allocator<char>::~allocator((allocator<char> *)&local_361);
  VW::config::typed_option<float>::~typed_option((typed_option<float> *)in_stack_fffffffffffff4a0);
  std::__cxx11::string::~string(local_338);
  std::allocator<char>::~allocator((allocator<char> *)&local_339);
  std::__cxx11::string::~string((string *)(local_271 + 1));
  std::allocator<char>::~allocator((allocator<char> *)local_271);
  VW::config::typed_option<unsigned_long>::~typed_option
            ((typed_option<unsigned_long> *)in_stack_fffffffffffff4a0);
  std::__cxx11::string::~string(local_248);
  std::allocator<char>::~allocator((allocator<char> *)&local_249);
  std::__cxx11::string::~string(local_180);
  std::allocator<char>::~allocator((allocator<char> *)&local_181);
  VW::config::typed_option<unsigned_int>::~typed_option
            ((typed_option<unsigned_int> *)in_stack_fffffffffffff4a0);
  std::__cxx11::string::~string(local_158);
  std::allocator<char>::~allocator((allocator<char> *)&local_159);
  (*(code *)**(undefined8 **)local_10)(local_10,local_60);
  plVar8 = local_10;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_658,"cb_explore",&local_659);
  bVar3 = (**(code **)(*(long *)plVar8 + 8))(plVar8,local_658);
  std::__cxx11::string::~string(local_658);
  std::allocator<char>::~allocator((allocator<char> *)&local_659);
  pvVar2 = local_18;
  if (((bVar3 ^ 0xff) & 1) == 0) {
    pcVar4 = std::unique_ptr<CB_EXPLORE::cb_explore,_void_(*)(void_*)>::operator->
                       ((unique_ptr<CB_EXPLORE::cb_explore,_void_(*)(void_*)> *)0x3057f5);
    pcVar4->all = pvVar2;
    pcVar4 = std::unique_ptr<CB_EXPLORE::cb_explore,_void_(*)(void_*)>::operator->
                       ((unique_ptr<CB_EXPLORE::cb_explore,_void_(*)(void_*)> *)0x30580d);
    plVar8 = local_10;
    local_664 = (pcVar4->cbcs).num_actions;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_688,"cb",&local_689);
    bVar3 = (**(code **)(*(long *)plVar8 + 8))(plVar8,local_688);
    std::__cxx11::string::~string(local_688);
    std::allocator<char>::~allocator((allocator<char> *)&local_689);
    if (((bVar3 ^ 0xff) & 1) != 0) {
      std::__cxx11::stringstream::stringstream(local_818);
      pcVar4 = std::unique_ptr<CB_EXPLORE::cb_explore,_void_(*)(void_*)>::operator->
                         ((unique_ptr<CB_EXPLORE::cb_explore,_void_(*)(void_*)> *)0x3058e2);
      std::ostream::operator<<(local_808,(pcVar4->cbcs).num_actions);
      plVar8 = local_10;
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_838,"cb",&local_839);
      std::__cxx11::stringstream::str();
      (**(code **)(*(long *)plVar8 + 0x28))(plVar8,local_838,local_860);
      std::__cxx11::string::~string(local_860);
      std::__cxx11::string::~string(local_838);
      std::allocator<char>::~allocator((allocator<char> *)&local_839);
      std::__cxx11::stringstream::~stringstream(local_818);
    }
    local_18->delete_prediction = ACTION_SCORE::delete_action_scores;
    pcVar4 = std::unique_ptr<CB_EXPLORE::cb_explore,_void_(*)(void_*)>::operator->
                       ((unique_ptr<CB_EXPLORE::cb_explore,_void_(*)(void_*)> *)0x305aa5);
    (pcVar4->cbcs).cb_type = 0;
    setup_base((options_i *)in_stack_fffffffffffff4a8,in_stack_fffffffffffff4a0);
    local_868 = LEARNER::as_singleline<char,char>((learner<char,_char> *)paVar9);
    psVar5 = local_18->scorer;
    pcVar4 = std::unique_ptr<CB_EXPLORE::cb_explore,_void_(*)(void_*)>::operator->
                       ((unique_ptr<CB_EXPLORE::cb_explore,_void_(*)(void_*)> *)0x305b14);
    plVar8 = local_10;
    (pcVar4->cbcs).scorer = psVar5;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_890,"cover",&local_891);
    bVar3 = (**(code **)(*(long *)plVar8 + 8))(plVar8,local_890);
    std::__cxx11::string::~string(local_890);
    std::allocator<char>::~allocator((allocator<char> *)&local_891);
    if ((bVar3 & 1) == 0) {
      paVar9 = &local_8f9;
      plVar8 = local_10;
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_8f8,"bag",paVar9);
      bVar3 = (**(code **)(*(long *)plVar8 + 8))(plVar8,local_8f8);
      std::__cxx11::string::~string(local_8f8);
      std::allocator<char>::~allocator((allocator<char> *)&local_8f9);
      if ((bVar3 & 1) == 0) {
        in_stack_fffffffffffff4c0 = &local_921;
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_920,"first",in_stack_fffffffffffff4c0);
        in_stack_fffffffffffff4b7 = (**(code **)(*(long *)local_10 + 8))(local_10,local_920);
        std::__cxx11::string::~string(local_920);
        std::allocator<char>::~allocator((allocator<char> *)&local_921);
        if ((in_stack_fffffffffffff4b7 & 1) == 0) {
          in_stack_fffffffffffff4a0 =
               (vw *)LEARNER::
                     init_learner<CB_EXPLORE::cb_explore,example,LEARNER::learner<char,example>>
                               ((free_ptr<CB_EXPLORE::cb_explore> *)in_stack_fffffffffffff4c0,
                                local_10,(_func_void_cb_explore_ptr_learner<char,_example>_ptr_example_ptr
                                          *)CONCAT17(in_stack_fffffffffffff4b7,
                                                     in_stack_fffffffffffff4b0),
                                (_func_void_cb_explore_ptr_learner<char,_example>_ptr_example_ptr *)
                                in_stack_fffffffffffff4a8,(size_t)in_stack_fffffffffffff4a0,
                                pred_type);
          local_870 = in_stack_fffffffffffff4a0;
        }
        else {
          local_870 = (vw *)LEARNER::
                            init_learner<CB_EXPLORE::cb_explore,example,LEARNER::learner<char,example>>
                                      ((free_ptr<CB_EXPLORE::cb_explore> *)in_stack_fffffffffffff4c0
                                       ,local_10,
                                       (_func_void_cb_explore_ptr_learner<char,_example>_ptr_example_ptr
                                        *)CONCAT17(in_stack_fffffffffffff4b7,
                                                   in_stack_fffffffffffff4b0),
                                       (_func_void_cb_explore_ptr_learner<char,_example>_ptr_example_ptr
                                        *)in_stack_fffffffffffff4a8,
                                       (size_t)in_stack_fffffffffffff4a0,pred_type);
        }
      }
      else {
        std::unique_ptr<CB_EXPLORE::cb_explore,_void_(*)(void_*)>::operator->
                  ((unique_ptr<CB_EXPLORE::cb_explore,_void_(*)(void_*)> *)0x305eb4);
        local_870 = (vw *)LEARNER::
                          init_learner<CB_EXPLORE::cb_explore,example,LEARNER::learner<char,example>>
                                    ((free_ptr<CB_EXPLORE::cb_explore> *)in_stack_fffffffffffff4c0,
                                     in_stack_fffffffffffff4b8,
                                     (_func_void_cb_explore_ptr_learner<char,_example>_ptr_example_ptr
                                      *)CONCAT17(in_stack_fffffffffffff4b7,in_stack_fffffffffffff4b0
                                                ),
                                     (_func_void_cb_explore_ptr_learner<char,_example>_ptr_example_ptr
                                      *)in_stack_fffffffffffff4a8,(size_t)in_stack_fffffffffffff4a0,
                                     pred_type);
        local_10 = in_stack_fffffffffffff4b8;
      }
    }
    else {
      psVar5 = LEARNER::as_singleline<char,char>((learner<char,_char> *)paVar9);
      pcVar4 = std::unique_ptr<CB_EXPLORE::cb_explore,_void_(*)(void_*)>::operator->
                         ((unique_ptr<CB_EXPLORE::cb_explore,_void_(*)(void_*)> *)0x305bdf);
      pcVar4->cs = (learner<CB_EXPLORE::cb_explore,_example> *)psVar5;
      std::unique_ptr<CB_EXPLORE::cb_explore,_void_(*)(void_*)>::operator->
                ((unique_ptr<CB_EXPLORE::cb_explore,_void_(*)(void_*)> *)0x305bfb);
      v_array<COST_SENSITIVE::wclass>::resize(this,(size_t)length);
      pcVar4 = std::unique_ptr<CB_EXPLORE::cb_explore,_void_(*)(void_*)>::operator->
                         ((unique_ptr<CB_EXPLORE::cb_explore,_void_(*)(void_*)> *)0x305c22);
      ppwVar6 = v_array<COST_SENSITIVE::wclass>::begin(&(pcVar4->second_cs_label).costs);
      pwVar1 = *ppwVar6;
      uVar7 = (ulong)local_664;
      pcVar4 = std::unique_ptr<CB_EXPLORE::cb_explore,_void_(*)(void_*)>::operator->
                         ((unique_ptr<CB_EXPLORE::cb_explore,_void_(*)(void_*)> *)0x305c69);
      ppwVar6 = v_array<COST_SENSITIVE::wclass>::end(&(pcVar4->second_cs_label).costs);
      *ppwVar6 = pwVar1 + uVar7;
      v_init<float>();
      pcVar4 = std::unique_ptr<CB_EXPLORE::cb_explore,_void_(*)(void_*)>::operator->
                         ((unique_ptr<CB_EXPLORE::cb_explore,_void_(*)(void_*)> *)0x305cb9);
      (pcVar4->cover_probs).end_array = local_8a8;
      (pcVar4->cover_probs).erase_count = sStack_8a0;
      (pcVar4->cover_probs)._begin = local_8b8;
      (pcVar4->cover_probs)._end = pfStack_8b0;
      std::unique_ptr<CB_EXPLORE::cb_explore,_void_(*)(void_*)>::operator->
                ((unique_ptr<CB_EXPLORE::cb_explore,_void_(*)(void_*)> *)0x305ce4);
      v_array<float>::resize((v_array<float> *)this,(size_t)length);
      v_init<unsigned_int>();
      pcVar4 = std::unique_ptr<CB_EXPLORE::cb_explore,_void_(*)(void_*)>::operator->
                         ((unique_ptr<CB_EXPLORE::cb_explore,_void_(*)(void_*)> *)0x305d1c);
      (pcVar4->preds).end_array = local_8c8;
      (pcVar4->preds).erase_count = sStack_8c0;
      (pcVar4->preds)._begin = local_8d8;
      (pcVar4->preds)._end = puStack_8d0;
      std::unique_ptr<CB_EXPLORE::cb_explore,_void_(*)(void_*)>::operator->
                ((unique_ptr<CB_EXPLORE::cb_explore,_void_(*)(void_*)> *)0x305d3e);
      std::unique_ptr<CB_EXPLORE::cb_explore,_void_(*)(void_*)>::operator->
                ((unique_ptr<CB_EXPLORE::cb_explore,_void_(*)(void_*)> *)0x305d54);
      v_array<unsigned_int>::resize((v_array<unsigned_int> *)this,(size_t)length);
      std::unique_ptr<CB_EXPLORE::cb_explore,_void_(*)(void_*)>::operator->
                ((unique_ptr<CB_EXPLORE::cb_explore,_void_(*)(void_*)> *)0x305d89);
      local_870 = (vw *)LEARNER::
                        init_learner<CB_EXPLORE::cb_explore,example,LEARNER::learner<char,example>>
                                  ((free_ptr<CB_EXPLORE::cb_explore> *)in_stack_fffffffffffff4c0,
                                   in_stack_fffffffffffff4b8,
                                   (_func_void_cb_explore_ptr_learner<char,_example>_ptr_example_ptr
                                    *)CONCAT17(in_stack_fffffffffffff4b7,in_stack_fffffffffffff4b0),
                                   (_func_void_cb_explore_ptr_learner<char,_example>_ptr_example_ptr
                                    *)in_stack_fffffffffffff4a8,(size_t)in_stack_fffffffffffff4a0,
                                   pred_type);
      local_10 = in_stack_fffffffffffff4b8;
    }
    LEARNER::learner<CB_EXPLORE::cb_explore,_example>::set_finish
              ((learner<CB_EXPLORE::cb_explore,_example> *)in_stack_fffffffffffff4c0,
               (_func_void_cb_explore_ptr *)local_10);
    LEARNER::learner<CB_EXPLORE::cb_explore,_example>::set_finish_example
              ((learner<CB_EXPLORE::cb_explore,_example> *)local_870,CB_EXPLORE::finish_example);
    local_8 = LEARNER::make_base<CB_EXPLORE::cb_explore,example>
                        ((learner<CB_EXPLORE::cb_explore,_example> *)local_870);
  }
  else {
    local_8 = (base_learner *)0x0;
  }
  local_660 = 1;
  VW::config::option_group_definition::~option_group_definition
            ((option_group_definition *)in_stack_fffffffffffff4a0);
  std::unique_ptr<CB_EXPLORE::cb_explore,_void_(*)(void_*)>::~unique_ptr
            ((unique_ptr<CB_EXPLORE::cb_explore,_void_(*)(void_*)> *)
             CONCAT17(in_stack_fffffffffffff4b7,in_stack_fffffffffffff4b0));
  return local_8;
}

Assistant:

base_learner* cb_explore_setup(options_i& options, vw& all)
{
  auto data = scoped_calloc_or_throw<cb_explore>();
  option_group_definition new_options("Contextual Bandit Exploration");
  new_options
      .add(make_option("cb_explore", data->cbcs.num_actions)
               .keep()
               .help("Online explore-exploit for a <k> action contextual bandit problem"))
      .add(make_option("first", data->tau).keep().help("tau-first exploration"))
      .add(make_option("epsilon", data->epsilon).keep().default_value(0.05f).help("epsilon-greedy exploration"))
      .add(make_option("bag", data->bag_size).keep().help("bagging-based exploration"))
      .add(make_option("cover", data->cover_size).keep().help("Online cover based exploration"))
      .add(make_option("psi", data->psi).keep().default_value(1.0f).help("disagreement parameter for cover"));
  options.add_and_parse(new_options);

  if (!options.was_supplied("cb_explore"))
    return nullptr;

  data->all = &all;
  uint32_t num_actions = data->cbcs.num_actions;

  if (!options.was_supplied("cb"))
  {
    stringstream ss;
    ss << data->cbcs.num_actions;
    options.insert("cb", ss.str());
  }

  all.delete_prediction = delete_action_scores;
  data->cbcs.cb_type = CB_TYPE_DR;

  single_learner* base = as_singleline(setup_base(options, all));
  data->cbcs.scorer = all.scorer;

  learner<cb_explore, example>* l;
  if (options.was_supplied("cover"))
  {
    data->cs = (learner<cb_explore, example>*)(as_singleline(all.cost_sensitive));
    data->second_cs_label.costs.resize(num_actions);
    data->second_cs_label.costs.end() = data->second_cs_label.costs.begin() + num_actions;
    data->cover_probs = v_init<float>();
    data->cover_probs.resize(num_actions);
    data->preds = v_init<uint32_t>();
    data->preds.resize(data->cover_size);
    l = &init_learner(data, base, predict_or_learn_cover<true>, predict_or_learn_cover<false>, data->cover_size + 1,
        prediction_type::action_probs);
  }
  else if (options.was_supplied("bag"))
    l = &init_learner(data, base, predict_or_learn_bag<true>, predict_or_learn_bag<false>, data->bag_size,
        prediction_type::action_probs);
  else if (options.was_supplied("first"))
    l = &init_learner(
        data, base, predict_or_learn_first<true>, predict_or_learn_first<false>, 1, prediction_type::action_probs);
  else  // greedy
    l = &init_learner(
        data, base, predict_or_learn_greedy<true>, predict_or_learn_greedy<false>, 1, prediction_type::action_probs);

  l->set_finish(finish);
  l->set_finish_example(finish_example);
  return make_base(*l);
}